

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::ShaderSourceReplaceCase::verifyShaderSourceReplaced
          (ShaderSourceReplaceCase *this,Shader *shader,string *firstSource,string *secondSource)

{
  __type _Var1;
  bool bVar2;
  MessageBuilder *pMVar3;
  MessageBuilder local_360;
  MessageBuilder local_1d0;
  undefined1 local_50 [8];
  string result;
  TestLog *log;
  string *secondSource_local;
  string *firstSource_local;
  Shader *shader_local;
  ShaderSourceReplaceCase *this_local;
  
  result.field_2._8_8_ =
       tcu::TestContext::getLog
                 ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  readSource_abi_cxx11_((string *)local_50,this,shader);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50,firstSource);
  if (_Var1) {
    tcu::TestLog::operator<<
              (&local_1d0,(TestLog *)result.field_2._8_8_,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1d0,(char (*) [31])"Fail, source was not replaced.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Shader source nor replaced");
  }
  else {
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,secondSource);
    if (bVar2) {
      tcu::TestLog::operator<<
                (&local_360,(TestLog *)result.field_2._8_8_,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (&local_360,(char (*) [29])"Fail, invalid shader source.");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_360);
      tcu::TestContext::setTestResult
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"Invalid source");
    }
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void verifyShaderSourceReplaced (glu::Shader& shader, const std::string& firstSource, const std::string& secondSource)
	{
		TestLog&			log		= m_testCtx.getLog();
		const std::string	result	= readSource(shader);

		if (result == firstSource)
		{
			log << TestLog::Message << "Fail, source was not replaced." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader source nor replaced");
		}
		else if (result != secondSource)
		{
			log << TestLog::Message << "Fail, invalid shader source." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid source");
		}
	}